

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O1

void __thiscall jbcoin::STAmount::setJson(STAmount *this,Value *elem)

{
  ushort uVar1;
  char *pcVar2;
  ValueHolder VVar3;
  undefined4 extraout_var_00;
  ValueHolder *pVVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Currency *extraout_RDX;
  Currency *extraout_RDX_00;
  Currency *currency;
  undefined1 in_R9B;
  ushort uVar5;
  ValueHolder local_50;
  ushort local_48;
  ValueHolder local_40;
  uint local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  undefined4 extraout_var;
  
  uVar5 = (ushort)local_38 & 0xfe00;
  local_38._0_2_ = uVar5 + 7;
  pcVar2 = (char *)operator_new(0x30);
  pcVar2[0x10] = '\0';
  pcVar2[0x11] = '\0';
  pcVar2[0x12] = '\0';
  pcVar2[0x13] = '\0';
  pcVar2[0x14] = '\0';
  pcVar2[0x15] = '\0';
  pcVar2[0x16] = '\0';
  pcVar2[0x17] = '\0';
  pcVar2[0x18] = '\0';
  pcVar2[0x19] = '\0';
  pcVar2[0x1a] = '\0';
  pcVar2[0x1b] = '\0';
  pcVar2[0x1c] = '\0';
  pcVar2[0x1d] = '\0';
  pcVar2[0x1e] = '\0';
  pcVar2[0x1f] = '\0';
  pcVar2[0x20] = '\0';
  pcVar2[0x21] = '\0';
  pcVar2[0x22] = '\0';
  pcVar2[0x23] = '\0';
  pcVar2[0x24] = '\0';
  pcVar2[0x25] = '\0';
  pcVar2[0x26] = '\0';
  pcVar2[0x27] = '\0';
  pcVar2[0x28] = '\0';
  pcVar2[0x29] = '\0';
  pcVar2[0x2a] = '\0';
  pcVar2[0x2b] = '\0';
  pcVar2[0x2c] = '\0';
  pcVar2[0x2d] = '\0';
  pcVar2[0x2e] = '\0';
  pcVar2[0x2f] = '\0';
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  pcVar2[8] = '\0';
  pcVar2[9] = '\0';
  pcVar2[10] = '\0';
  pcVar2[0xb] = '\0';
  pcVar2[0xc] = '\0';
  pcVar2[0xd] = '\0';
  pcVar2[0xe] = '\0';
  pcVar2[0xf] = '\0';
  *(char **)(pcVar2 + 0x18) = pcVar2 + 8;
  *(char **)(pcVar2 + 0x20) = pcVar2 + 8;
  pcVar2[0x28] = '\0';
  pcVar2[0x29] = '\0';
  pcVar2[0x2a] = '\0';
  pcVar2[0x2b] = '\0';
  pcVar2[0x2c] = '\0';
  pcVar2[0x2d] = '\0';
  pcVar2[0x2e] = '\0';
  pcVar2[0x2f] = '\0';
  local_40 = (ValueHolder)(elem->value_).real_;
  (elem->value_).string_ = pcVar2;
  uVar1 = *(ushort *)&elem->field_0x8;
  *(ushort *)&elem->field_0x8 = uVar1 & 0xff00 | 7;
  *(ushort *)&elem->field_0x8 = uVar1 & 0xfe00 | 7;
  local_38 = CONCAT22(local_38._2_2_,uVar1 & 0x100 | uVar1 & 0xff | uVar5);
  Json::Value::~Value((Value *)&local_40);
  if (this->mIsNative == false) {
    (*(this->super_STBase)._vptr_STBase[6])(&local_40,this);
    uVar5 = local_48 & 0xfe00;
    local_48 = uVar5 + 0x104;
    Json::valueAllocator();
    local_50._0_4_ =
         (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                   (Json::valueAllocator::valueAllocator,local_40.real_,(ulong)local_38);
    local_50._4_4_ = extraout_var_00;
    pVVar4 = &Json::Value::resolveReference(elem,"value",true)->value_;
    VVar3 = *pVVar4;
    *pVVar4 = local_50;
    uVar1 = *(ushort *)(pVVar4 + 1);
    pVVar4[1].bool_ = true;
    *(ushort *)(pVVar4 + 1) = uVar1 & 0xff04 | 0x104;
    local_48 = uVar1 & 0x100 | uVar5 | uVar1 & 0xff;
    local_50 = VVar3;
    Json::Value::~Value((Value *)&local_50);
    currency = extraout_RDX;
    if (local_40 != &local_30) {
      operator_delete(local_40.string_,local_30._M_allocated_capacity + 1);
      currency = extraout_RDX_00;
    }
    to_string_abi_cxx11_((string *)&local_40,(jbcoin *)&this->mIssue,currency);
    uVar5 = local_48 & 0xfe00;
    local_48 = uVar5 + 0x104;
    Json::valueAllocator();
    local_50._0_4_ =
         (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                   (Json::valueAllocator::valueAllocator,local_40.real_,(ulong)local_38);
    local_50._4_4_ = extraout_var_01;
    pVVar4 = &Json::Value::resolveReference(elem,"currency",true)->value_;
    VVar3 = *pVVar4;
    *pVVar4 = local_50;
    uVar1 = *(ushort *)(pVVar4 + 1);
    pVVar4[1].bool_ = true;
    *(ushort *)(pVVar4 + 1) = uVar1 & 0xff04 | 0x104;
    local_48 = uVar1 & 0x100 | uVar5 | uVar1 & 0xff;
    local_50 = VVar3;
    Json::Value::~Value((Value *)&local_50);
    if (local_40 != &local_30) {
      operator_delete(local_40.string_,local_30._M_allocated_capacity + 1);
    }
    encodeToken_abi_cxx11_
              ((string *)&local_40,(jbcoin *)0x0,(char)this + '$',(void *)0x14,0,(bool)in_R9B);
    uVar5 = local_48 & 0xfe00;
    local_48 = uVar5 + 0x104;
    Json::valueAllocator();
    local_50._0_4_ =
         (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                   (Json::valueAllocator::valueAllocator,local_40.real_,(ulong)local_38);
    local_50._4_4_ = extraout_var_02;
    pVVar4 = &Json::Value::resolveReference(elem,"issuer",true)->value_;
    VVar3 = *pVVar4;
    *pVVar4 = local_50;
    uVar1 = *(ushort *)(pVVar4 + 1);
    pVVar4[1].bool_ = true;
    *(ushort *)(pVVar4 + 1) = uVar1 & 0xff04 | 0x104;
    local_48 = uVar1 & 0x100 | uVar5 | uVar1 & 0xff;
    local_50 = VVar3;
    Json::Value::~Value((Value *)&local_50);
    if (local_40 == &local_30) {
      return;
    }
  }
  else {
    (*(this->super_STBase)._vptr_STBase[6])(&local_40,this);
    uVar5 = local_48 & 0xfe00;
    local_48 = uVar5 + 0x104;
    Json::valueAllocator();
    VVar3._0_4_ = (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                            (Json::valueAllocator::valueAllocator,local_40.real_,(ulong)local_38);
    VVar3._4_4_ = extraout_var;
    local_50 = elem->value_;
    elem->value_ = VVar3;
    uVar1 = *(ushort *)&elem->field_0x8;
    elem->field_0x8 = 4;
    *(ushort *)&elem->field_0x8 = uVar1 & 0xff04 | 0x104;
    local_48 = uVar1 & 0x100 | uVar5 | uVar1 & 0xff;
    Json::Value::~Value((Value *)&local_50);
    if (local_40 == &local_30) {
      return;
    }
  }
  operator_delete(local_40.string_,local_30._M_allocated_capacity + 1);
  return;
}

Assistant:

void STAmount::setJson (Json::Value& elem) const
{
    elem = Json::objectValue;

    if (!mIsNative)
    {
        // It is an error for currency or issuer not to be specified for valid
        // json.
        elem[jss::value]      = getText ();
        elem[jss::currency]   = to_string (mIssue.currency);
        elem[jss::issuer]     = to_string (mIssue.account);
    }
    else
    {
        elem = getText ();
    }
}